

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_host.c
# Opt level: O3

void mpifftnd_dif(int *dim,int *pdim,int ndim,int *pidx,int inv,int size_in,int *inembed,int *oembed
                 ,cpx_t *work,cpx_t *scratch,plan_t *plans_short,plan_t *plans_long,int **rho_L,
                 int **rho_pk0,int **rho_Lk0,int *dfft_nsend,int *dfft_nrecv,int *dfft_offset_send,
                 int *dfft_offset_recv,MPI_Comm comm,int *proc_map,int row_m)

{
  plan_t *ppVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  plan_t plan_short;
  plan_t plan_long;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  cpx_t *pcVar19;
  ulong uVar20;
  ulong uVar21;
  int *in_stack_ffffffffffffff28;
  
  if (0 < ndim) {
    uVar17 = 0;
    do {
      uVar4 = plans_short[uVar17].odist;
      uVar6 = plans_short[uVar17].howmany;
      plan_short.howmany = uVar6;
      plan_short.odist = uVar4;
      ppVar1 = plans_short + uVar17;
      uVar8 = ppVar1->n;
      uVar9 = ppVar1->istride;
      uVar10 = ppVar1->ostride;
      uVar11 = ppVar1->idist;
      plan_short.idist = uVar11;
      plan_short.ostride = uVar10;
      plan_short.istride = uVar9;
      plan_short.n = uVar8;
      uVar5 = plans_long[uVar17].odist;
      uVar7 = plans_long[uVar17].howmany;
      plan_long.howmany = uVar7;
      plan_long.odist = uVar5;
      ppVar1 = plans_long + uVar17;
      uVar12 = ppVar1->n;
      uVar13 = ppVar1->istride;
      uVar14 = ppVar1->ostride;
      uVar15 = ppVar1->idist;
      plan_long.idist = uVar15;
      plan_long.ostride = uVar14;
      plan_long.istride = uVar13;
      plan_long.n = uVar12;
      mpifft1d_dif(dim,pdim,ndim,(int)uVar17,pidx,inv,size_in,inembed,work,scratch,plan_short,
                   plan_long,rho_L[uVar17],rho_pk0[uVar17],in_stack_ffffffffffffff28,dfft_nsend,
                   dfft_nrecv,dfft_offset_send,dfft_offset_recv,comm,proc_map,row_m);
      iVar2 = dim[uVar17];
      iVar3 = pdim[uVar17];
      iVar18 = inembed[uVar17];
      if (0 < (int)((long)iVar2 / (long)iVar3)) {
        uVar16 = (long)size_in / (long)iVar18 & 0xffffffff;
        uVar20 = 0;
        pcVar19 = scratch;
        do {
          if (0 < (int)((long)size_in / (long)iVar18)) {
            uVar21 = 0;
            do {
              work[oembed[uVar17] * (int)uVar21 + (int)uVar20] = pcVar19[uVar21];
              uVar21 = uVar21 + 1;
            } while (uVar16 != uVar21);
          }
          uVar20 = uVar20 + 1;
          pcVar19 = pcVar19 + uVar16;
        } while (uVar20 != ((long)iVar2 / (long)iVar3 & 0xffffffffU));
        iVar18 = inembed[uVar17];
      }
      size_in = (size_in * oembed[uVar17]) / iVar18;
      uVar17 = uVar17 + 1;
    } while (uVar17 != (uint)ndim);
  }
  return;
}

Assistant:

void mpifftnd_dif(int *dim,
            int *pdim,
            int ndim,
            int* pidx,
            int inv,
            int size_in,
            int *inembed,
            int *oembed,
            cpx_t *work,
            cpx_t *scratch,
            plan_t *plans_short,
            plan_t *plans_long,
            int **rho_L,
            int **rho_pk0,
            int **rho_Lk0,
            int *dfft_nsend,
            int *dfft_nrecv,
            int *dfft_offset_send,
            int *dfft_offset_recv,
            MPI_Comm comm,
            int *proc_map,
            int row_m)
    {
    int size = size_in;
    int current_dim;
    for (current_dim = 0; current_dim < ndim; ++current_dim)
        {
        /* assume input in local column major */
        mpifft1d_dif(dim, pdim,ndim,current_dim,pidx, inv,
            size, inembed, work, scratch, plans_short[current_dim],
            plans_long[current_dim], rho_L[current_dim],
            rho_pk0[current_dim],rho_Lk0[current_dim],
            dfft_nsend,dfft_nrecv,dfft_offset_send,dfft_offset_recv,
            comm,proc_map, row_m);

        int l = dim[current_dim]/pdim[current_dim];
        int stride = size/inembed[current_dim];

        /* transpose local matrix */
        int i;
        #pragma omp parallel for private(i)
        for (i = 0; i < l; ++i)
            {
            int j;
            for (j = 0; j < stride; ++j)
                {
                int gidx = j+i*stride;
                int new_idx = j*oembed[current_dim]+i;
                work[new_idx] = scratch[gidx];
                }
            }

        /* update size */
        size *= oembed[current_dim];
        size /= inembed[current_dim];
        }
    }